

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::ScrollIndicator::drawIndicator(ScrollIndicator *this,QPainter *p,QColor *c)

{
  int x1;
  int middle;
  QBrush local_40 [8];
  QPen local_38 [8];
  undefined8 local_30;
  QColor paintColor;
  QColor *c_local;
  QPainter *p_local;
  ScrollIndicator *this_local;
  
  if (this->policy != ScrollIndicatorAlwaysOff) {
    local_30 = *(undefined8 *)c;
    paintColor._0_8_ = *(undefined8 *)((long)&c->ct + 4);
    paintColor._8_8_ = c;
    if (((this->animate & 1U) != 0) && (this->policy != ScrollIndicatorAlwaysOn)) {
      QColor::setAlpha((int)&local_30);
    }
    QBrush::QBrush(local_40,(QColor *)&local_30,SolidPattern);
    QPen::QPen((QPen *)(double)this->width,local_38,local_40,1,0x20,0x40);
    QPainter::setPen((QPen *)p);
    QPen::~QPen(local_38);
    QBrush::~QBrush(local_40);
    x1 = this->width / 2;
    if (this->orientation == Horizontal) {
      QPainter::drawLine(p,0,x1,this->size,x1);
    }
    else {
      QPainter::drawLine(p,x1,0,x1,this->size);
    }
  }
  return;
}

Assistant:

void
ScrollIndicator::drawIndicator( QPainter * p, const QColor & c )
{
	if( policy != AbstractScrollArea::ScrollIndicatorAlwaysOff )
	{
		QColor paintColor = c;

		if( animate && policy != AbstractScrollArea::ScrollIndicatorAlwaysOn )
			paintColor.setAlpha( alpha );

		p->setPen( QPen( paintColor, width, Qt::SolidLine, Qt::RoundCap ) );

		const int middle = width / 2;

		if( orientation == Qt::Horizontal )
			p->drawLine( 0, middle, size, middle );
		else
			p->drawLine( middle, 0, middle, size );
	}
}